

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O1

int cram_compress_block(cram_fd *fd,cram_block *b,cram_metrics *metrics,int method,int level)

{
  int32_t *piVar1;
  pthread_mutex_t *__mutex;
  pthread_mutex_t *__mutex_00;
  cram_block_method cVar2;
  int iVar3;
  uchar *puVar4;
  uchar *puVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  bool bVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  uint out_size_i;
  size_t sz_gz_def;
  size_t sz_gz_rle;
  size_t comp_size;
  cram_block_method local_7c;
  ulong local_78;
  uint local_64;
  size_t local_60;
  size_t local_58;
  size_t local_50;
  cram_fd *local_48;
  ulong local_40;
  pthread_mutex_t *local_38;
  
  local_50 = 0;
  if ((level == 0 || method == 0) || ((long)b->uncomp_size == 0)) {
    b->method = RAW;
    b->comp_size = b->uncomp_size;
    return 0;
  }
  piVar1 = &b->uncomp_size;
  if (metrics == (cram_metrics *)0x0) {
    puVar4 = (uchar *)cram_compress_by_method
                                ((char *)b->data,(long)b->uncomp_size,&local_50,GZIP,level,1);
    if (puVar4 == (uchar *)0x0) {
      cram_compress_block_cold_2();
      return -1;
    }
    free(b->data);
    b->data = puVar4;
    b->comp_size = (int32_t)local_50;
    b->method = GZIP;
    goto LAB_0012e1c3;
  }
  __mutex = &fd->metrics_lock;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if ((metrics->trial < 1) &&
     (iVar11 = metrics->next_trial, metrics->next_trial = iVar11 + -1, 1 < iVar11)) {
    cVar2 = metrics->method;
    iVar11 = metrics->strat;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    puVar4 = (uchar *)cram_compress_by_method
                                ((char *)b->data,(long)b->uncomp_size,&local_50,cVar2,level,iVar11);
    if (puVar4 == (uchar *)0x0) {
      return -1;
    }
    free(b->data);
    b->data = puVar4;
    b->comp_size = (int32_t)local_50;
    b->method = cVar2;
    goto LAB_0012e1c3;
  }
  local_58 = 0;
  local_60 = 0;
  uVar9 = metrics->revised_method;
  if (metrics->revised_method == 0) {
    metrics->revised_method = method;
    uVar9 = method;
  }
  if (metrics->next_trial == 0) {
    metrics->trial = 3;
    metrics->next_trial = 0x32;
    metrics->sz_gz_rle = metrics->sz_gz_rle / 2;
    metrics->sz_gz_def = metrics->sz_gz_def / 2;
    metrics->sz_rans0 = metrics->sz_rans0 / 2;
    metrics->sz_rans1 = metrics->sz_rans1 / 2;
    metrics->sz_bzip2 = metrics->sz_bzip2 / 2;
    metrics->sz_lzma = metrics->sz_lzma / 2;
  }
  local_48 = fd;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  uVar13 = 0x7fffffff;
  if ((uVar9 >> 0xb & 1) == 0) {
    puVar4 = (uchar *)0x0;
    local_7c = RAW;
  }
  else {
    puVar4 = (uchar *)cram_compress_by_method
                                ((char *)b->data,(long)b->uncomp_size,&local_58,GZIP,1,3);
    if (puVar4 == (uchar *)0x0) {
      local_58 = (long)*piVar1 * 2 + 1000;
    }
    else {
      if (local_58 < 0x7fffffff) {
        local_7c = GZIP_RLE;
        uVar13 = local_58;
        goto LAB_0012db93;
      }
      free(puVar4);
    }
    puVar4 = (uchar *)0x0;
    local_7c = RAW;
  }
LAB_0012db93:
  puVar5 = puVar4;
  local_78 = uVar13;
  if ((uVar9 & 2) != 0) {
    puVar5 = (uchar *)cram_compress_by_method
                                ((char *)b->data,(long)b->uncomp_size,&local_60,GZIP,level,1);
    if (puVar5 == (uchar *)0x0) {
      local_60 = (long)*piVar1 * 2 + 1000;
      puVar5 = puVar4;
    }
    else {
      local_78 = local_60;
      if (local_60 < uVar13) {
        local_7c = GZIP;
        if (puVar4 != (uchar *)0x0) {
          free(puVar4);
        }
      }
      else {
        free(puVar5);
        puVar5 = puVar4;
        local_78 = uVar13;
      }
    }
  }
  uVar8 = 0;
  if ((uVar9 & 0x10) == 0) {
    uVar13 = 0;
    puVar4 = puVar5;
  }
  else {
    puVar4 = rans_compress(b->data,b->uncomp_size,&local_64,0);
    if (puVar4 == (uchar *)0x0) {
      uVar13 = (ulong)(*piVar1 * 2 + 1000);
      puVar4 = puVar5;
    }
    else {
      uVar13 = (ulong)local_64;
      if (uVar13 < local_78) {
        local_7c = RANS;
        local_78 = uVar13;
        if (puVar5 != (uchar *)0x0) {
          free(puVar5);
        }
      }
      else {
        free(puVar4);
        puVar4 = puVar5;
      }
    }
  }
  puVar5 = puVar4;
  local_40 = uVar13;
  local_38 = (pthread_mutex_t *)__mutex;
  if ((uVar9 >> 10 & 1) != 0) {
    puVar5 = rans_compress(b->data,b->uncomp_size,&local_64,1);
    if (puVar5 == (uchar *)0x0) {
      puVar5 = puVar4;
      uVar8 = *piVar1 * 2 + 1000;
    }
    else {
      uVar13 = (ulong)local_64;
      uVar8 = local_64;
      if (uVar13 < local_78) {
        local_7c = RANS1;
        local_78 = uVar13;
        if (puVar4 != (uchar *)0x0) {
          free(puVar4);
        }
      }
      else {
        free(puVar5);
        puVar5 = puVar4;
      }
    }
  }
  iVar14 = 0;
  iVar11 = 0;
  if ((uVar9 & 4) != 0) {
    iVar11 = *piVar1 * 2 + 1000;
  }
  if ((uVar9 & 8) != 0) {
    iVar14 = *piVar1 * 2 + 1000;
  }
  free(b->data);
  __mutex_00 = local_38;
  b->data = puVar5;
  cVar2 = GZIP;
  if (local_7c != GZIP_RLE) {
    cVar2 = local_7c;
  }
  b->method = cVar2;
  b->comp_size = (int32_t)local_78;
  pthread_mutex_lock(local_38);
  iVar7 = metrics->sz_gz_rle + (int)local_58;
  metrics->sz_gz_rle = iVar7;
  iVar3 = metrics->sz_gz_def + (int)local_60;
  metrics->sz_gz_def = iVar3;
  iVar10 = (int)local_40 + metrics->sz_rans0;
  metrics->sz_rans0 = iVar10;
  iVar12 = uVar8 + metrics->sz_rans1;
  metrics->sz_rans1 = iVar12;
  iVar11 = iVar11 + metrics->sz_bzip2;
  metrics->sz_bzip2 = iVar11;
  iVar14 = iVar14 + metrics->sz_lzma;
  metrics->sz_lzma = iVar14;
  metrics->trial = metrics->trial + -1;
  if (metrics->trial == 0) {
    if (local_48->level < 4) {
      dVar16 = 1.1;
      dVar17 = 1.08;
      dVar18 = 1.04;
      dVar19 = 1.02;
LAB_0012de2b:
      metrics->sz_rans1 = (int)((double)iVar12 * dVar19);
      metrics->sz_gz_def = (int)((double)iVar3 * dVar18);
      metrics->sz_bzip2 = (int)((double)iVar11 * dVar17);
      metrics->sz_lzma = (int)((double)iVar14 * dVar16);
    }
    else if (local_48->level < 7) {
      dVar16 = 1.05;
      dVar17 = 1.03;
      dVar18 = 1.02;
      dVar19 = 1.01;
      goto LAB_0012de2b;
    }
    uVar8 = 0xb;
    if (iVar7 == 0x7fffffff) {
      uVar8 = 0;
    }
    uVar8 = uVar8 & (int)(uVar9 << 0x14) >> 0x1f;
    iVar11 = 0x7fffffff;
    if ((uVar9 >> 0xb & 1) != 0) {
      iVar11 = iVar7;
    }
    if ((uVar9 & 2) != 0) {
      iVar14 = metrics->sz_gz_def;
      if (iVar14 < iVar11) {
        uVar8 = 1;
      }
      if (iVar14 <= iVar11) {
        iVar11 = iVar14;
      }
    }
    uVar6 = 4;
    if (iVar11 <= iVar10) {
      uVar6 = uVar8;
    }
    iVar14 = iVar10;
    if (iVar11 < iVar10) {
      iVar14 = iVar11;
    }
    if ((uVar9 & 0x10) == 0) {
      iVar14 = iVar11;
      uVar6 = uVar8;
    }
    if ((uVar9 >> 10 & 1) != 0) {
      iVar11 = metrics->sz_rans1;
      if (iVar11 < iVar14) {
        uVar6 = 10;
      }
      if (iVar11 <= iVar14) {
        iVar14 = iVar11;
      }
    }
    if ((uVar9 & 4) != 0) {
      iVar11 = metrics->sz_bzip2;
      if (iVar11 < iVar14) {
        uVar6 = 2;
      }
      if (iVar11 <= iVar14) {
        iVar14 = iVar11;
      }
    }
    if ((uVar9 & 8) != 0) {
      iVar11 = metrics->sz_lzma;
      if (iVar11 < iVar14) {
        uVar6 = 3;
      }
      if (iVar11 <= iVar14) {
        iVar14 = iVar11;
      }
    }
    bVar15 = uVar6 == 0xb;
    uVar8 = 1;
    if (!bVar15) {
      uVar8 = uVar6;
    }
    metrics->method = uVar8;
    metrics->strat = (uint)bVar15 * 2 + 1;
    if (bVar15) {
      metrics->gz_rle_cnt = 0;
      metrics->gz_rle_extra = 0.0;
    }
    else if (((iVar14 < iVar7) &&
             (iVar11 = metrics->gz_rle_cnt, metrics->gz_rle_cnt = iVar11 + 1, 2 < iVar11)) &&
            (dVar16 = (double)iVar7 / (double)iVar14 + -1.0 + metrics->gz_rle_extra,
            metrics->gz_rle_extra = dVar16, 0.2 <= dVar16)) {
      uVar9 = uVar9 & 0xfffff7ff;
    }
    if (uVar6 == 1) {
      metrics->gz_def_cnt = 0;
      metrics->gz_def_extra = 0.0;
    }
    else if (((iVar14 < metrics->sz_gz_def) &&
             (iVar11 = metrics->gz_def_cnt, metrics->gz_def_cnt = iVar11 + 1, 2 < iVar11)) &&
            (dVar16 = (double)metrics->sz_gz_def / (double)iVar14 + -1.0 + metrics->gz_def_extra,
            metrics->gz_def_extra = dVar16, 0.2 <= dVar16)) {
      uVar9 = uVar9 & 0xfffffffd;
    }
    if (uVar6 == 4) {
      metrics->rans0_cnt = 0;
      metrics->rans0_extra = 0.0;
    }
    else if (((iVar14 < iVar10) &&
             (iVar11 = metrics->rans0_cnt, metrics->rans0_cnt = iVar11 + 1, 2 < iVar11)) &&
            (dVar16 = (double)iVar10 / (double)iVar14 + -1.0 + metrics->rans0_extra,
            metrics->rans0_extra = dVar16, 0.2 <= dVar16)) {
      uVar9 = uVar9 & 0xffffffef;
    }
    if (uVar6 == 10) {
      metrics->rans1_cnt = 0;
      metrics->rans1_extra = 0.0;
    }
    else if (((iVar14 < metrics->sz_rans1) &&
             (iVar11 = metrics->rans1_cnt, metrics->rans1_cnt = iVar11 + 1, 2 < iVar11)) &&
            (dVar16 = (double)metrics->sz_rans1 / (double)iVar14 + -1.0 + metrics->rans1_extra,
            metrics->rans1_extra = dVar16, 0.2 <= dVar16)) {
      uVar9 = uVar9 & 0xfffffbff;
    }
    if (uVar6 == 2) {
      metrics->bzip2_cnt = 0;
      metrics->bzip2_extra = 0.0;
    }
    else if (((iVar14 < metrics->sz_bzip2) &&
             (iVar11 = metrics->bzip2_cnt, metrics->bzip2_cnt = iVar11 + 1, 2 < iVar11)) &&
            (dVar16 = (double)metrics->sz_bzip2 / (double)iVar14 + -1.0 + metrics->bzip2_extra,
            metrics->bzip2_extra = dVar16, 0.2 <= dVar16)) {
      uVar9 = uVar9 & 0xfffffffb;
    }
    if (uVar6 == 3) {
      metrics->lzma_cnt = 0;
      metrics->lzma_extra = 0.0;
    }
    else if (((iVar14 < metrics->sz_lzma) &&
             (iVar11 = metrics->lzma_cnt, metrics->lzma_cnt = iVar11 + 1, 2 < iVar11)) &&
            (dVar16 = (double)metrics->sz_lzma / (double)iVar14 + -1.0 + metrics->lzma_extra,
            metrics->lzma_extra = dVar16, 0.2 <= dVar16)) {
      uVar9 = uVar9 & 0xfffffff7;
    }
    metrics->revised_method = uVar9;
  }
  pthread_mutex_unlock(__mutex_00);
  fd = local_48;
LAB_0012e1c3:
  if (fd->verbose != 0) {
    cram_compress_block_cold_1();
  }
  if (b->method == RANS1) {
    b->method = RANS;
  }
  return 0;
}

Assistant:

int cram_compress_block(cram_fd *fd, cram_block *b, cram_metrics *metrics,
			int method, int level) {

    char *comp = NULL;
    size_t comp_size = 0;
    int strat;

    //fprintf(stderr, "IN: block %d, sz %d\n", b->content_id, b->uncomp_size);

    if (method == RAW || level == 0 || b->uncomp_size == 0) {
	b->method = RAW;
	b->comp_size = b->uncomp_size;
	//fprintf(stderr, "Skip block id %d\n", b->content_id);
	return 0;
    }

    if (metrics) {
	pthread_mutex_lock(&fd->metrics_lock);
	if (metrics->trial > 0 || --metrics->next_trial <= 0) {
	    size_t sz_best = INT_MAX;
	    size_t sz_gz_rle = 0;
	    size_t sz_gz_def = 0;
	    size_t sz_rans0 = 0;
	    size_t sz_rans1 = 0;
	    size_t sz_bzip2 = 0;
	    size_t sz_lzma = 0;
	    int method_best = 0;
	    char *c_best = NULL, *c = NULL;

	    if (metrics->revised_method)
		method = metrics->revised_method;
	    else
		metrics->revised_method = method;

	    if (metrics->next_trial == 0) {
		metrics->next_trial = TRIAL_SPAN;
		metrics->trial = NTRIALS;
		metrics->sz_gz_rle /= 2;
		metrics->sz_gz_def /= 2;
		metrics->sz_rans0  /= 2;
		metrics->sz_rans1  /= 2;
		metrics->sz_bzip2  /= 2;
		metrics->sz_lzma   /= 2;
	    }

	    pthread_mutex_unlock(&fd->metrics_lock);
	    
	    if (method & (1<<GZIP_RLE)) {
		c = cram_compress_by_method((char *)b->data, b->uncomp_size,
					    &sz_gz_rle, GZIP, 1, Z_RLE);
		if (c && sz_best > sz_gz_rle) {
		    sz_best = sz_gz_rle;
		    method_best = GZIP_RLE;
		    if (c_best)
			free(c_best);
		    c_best = c;
		} else if (c) {
		    free(c);
		} else {
		    sz_gz_rle = b->uncomp_size*2+1000;
		}

		//fprintf(stderr, "Block %d; %d->%d\n", b->content_id, b->uncomp_size, sz_gz_rle);
	    }

	    if (method & (1<<GZIP)) {
		c = cram_compress_by_method((char *)b->data, b->uncomp_size,
					    &sz_gz_def, GZIP, level,
					    Z_FILTERED);
		if (c && sz_best > sz_gz_def) {
		    sz_best = sz_gz_def;
		    method_best = GZIP;
		    if (c_best)
			free(c_best);
		    c_best = c;
		} else if (c) {
		    free(c);
		} else {
		    sz_gz_def = b->uncomp_size*2+1000;
		}

		//fprintf(stderr, "Block %d; %d->%d\n", b->content_id, b->uncomp_size, sz_gz_def);
	    }

	    if (method & (1<<RANS0)) {
		c = cram_compress_by_method((char *)b->data, b->uncomp_size,
					    &sz_rans0, RANS0, 0, 0);
		if (c && sz_best > sz_rans0) {
		    sz_best = sz_rans0;
		    method_best = RANS0;
		    if (c_best)
			free(c_best);
		    c_best = c;
		} else if (c) {
		    free(c);
		} else {
		    sz_rans0 = b->uncomp_size*2+1000;
		}
	    }

	    if (method & (1<<RANS1)) {
		c = cram_compress_by_method((char *)b->data, b->uncomp_size,
					    &sz_rans1, RANS1, 0, 0);
		if (c && sz_best > sz_rans1) {
		    sz_best = sz_rans1;
		    method_best = RANS1;
		    if (c_best)
			free(c_best);
		    c_best = c;
		} else if (c) {
		    free(c);
		} else {
		    sz_rans1 = b->uncomp_size*2+1000;
		}
	    }

	    if (method & (1<<BZIP2)) {
		c = cram_compress_by_method((char *)b->data, b->uncomp_size,
					    &sz_bzip2, BZIP2, level, 0);
		if (c && sz_best > sz_bzip2) {
		    sz_best = sz_bzip2;
		    method_best = BZIP2;
		    if (c_best)
			free(c_best);
		    c_best = c;
		} else if (c) {
		    free(c);
		} else {
		    sz_bzip2 = b->uncomp_size*2+1000;
		}
	    }

	    if (method & (1<<LZMA)) {
		c = cram_compress_by_method((char *)b->data, b->uncomp_size,
					    &sz_lzma, LZMA, level, 0);
		if (c && sz_best > sz_lzma) {
		    sz_best = sz_lzma;
		    method_best = LZMA;
		    if (c_best)
			free(c_best);
		    c_best = c;
		} else if (c) {
		    free(c);
		} else {
		    sz_lzma = b->uncomp_size*2+1000;
		}
	    }

	    //fprintf(stderr, "sz_best = %d\n", sz_best);

	    free(b->data);
	    b->data = (unsigned char *)c_best;
	    //printf("method_best = %s\n", cram_block_method2str(method_best));
	    b->method = method_best == GZIP_RLE ? GZIP : method_best;
	    b->comp_size = sz_best;

	    pthread_mutex_lock(&fd->metrics_lock);
	    metrics->sz_gz_rle += sz_gz_rle;
	    metrics->sz_gz_def += sz_gz_def;
	    metrics->sz_rans0  += sz_rans0;
	    metrics->sz_rans1  += sz_rans1;
	    metrics->sz_bzip2  += sz_bzip2;
	    metrics->sz_lzma   += sz_lzma;
	    if (--metrics->trial == 0) {
		int best_method = RAW;
		int best_sz = INT_MAX;

		// Scale methods by cost
		if (fd->level <= 3) {
		    metrics->sz_rans1  *= 1.02;
		    metrics->sz_gz_def *= 1.04;
		    metrics->sz_bzip2  *= 1.08;
		    metrics->sz_lzma   *= 1.10;
		} else if (fd->level <= 6) {
		    metrics->sz_rans1  *= 1.01;
		    metrics->sz_gz_def *= 1.02;
		    metrics->sz_bzip2  *= 1.03;
		    metrics->sz_lzma   *= 1.05;
		}

		if (method & (1<<GZIP_RLE) && best_sz > metrics->sz_gz_rle)
		    best_sz = metrics->sz_gz_rle, best_method = GZIP_RLE;

		if (method & (1<<GZIP) && best_sz > metrics->sz_gz_def)
		    best_sz = metrics->sz_gz_def, best_method = GZIP;

		if (method & (1<<RANS0) && best_sz > metrics->sz_rans0)
		    best_sz = metrics->sz_rans0, best_method = RANS0;

		if (method & (1<<RANS1) && best_sz > metrics->sz_rans1)
		    best_sz = metrics->sz_rans1, best_method = RANS1;

		if (method & (1<<BZIP2) && best_sz > metrics->sz_bzip2)
		    best_sz = metrics->sz_bzip2, best_method = BZIP2;

		if (method & (1<<LZMA) && best_sz > metrics->sz_lzma)
		    best_sz = metrics->sz_lzma, best_method = LZMA;

		if (best_method == GZIP_RLE) {
		    metrics->method = GZIP;
		    metrics->strat  = Z_RLE;
		} else {
		    metrics->method = best_method;
		    metrics->strat  = Z_FILTERED;
		}

		// If we see at least MAXFAIL trials in a row for a specific
		// compression method with more than MAXDELTA aggregate
		// size then we drop this from the list of methods used
		// for this block type.
#define MAXDELTA 0.20
#define MAXFAILS 4
		if (best_method == GZIP_RLE) {
		    metrics->gz_rle_cnt = 0;
		    metrics->gz_rle_extra = 0;
		} else if (best_sz < metrics->sz_gz_rle) {
		    double r = (double)metrics->sz_gz_rle / best_sz - 1;
		    if (++metrics->gz_rle_cnt >= MAXFAILS && 
			(metrics->gz_rle_extra += r) >= MAXDELTA)
			method &= ~(1<<GZIP_RLE);
		}

		if (best_method == GZIP) {
		    metrics->gz_def_cnt = 0;
		    metrics->gz_def_extra = 0;
		} else if (best_sz < metrics->sz_gz_def) {
		    double r = (double)metrics->sz_gz_def / best_sz - 1;
		    if (++metrics->gz_def_cnt >= MAXFAILS &&
			(metrics->gz_def_extra += r) >= MAXDELTA)
			method &= ~(1<<GZIP);
		}

		if (best_method == RANS0) {
		    metrics->rans0_cnt = 0;
		    metrics->rans0_extra = 0;
		} else if (best_sz < metrics->sz_rans0) {
		    double r = (double)metrics->sz_rans0 / best_sz - 1;
		    if (++metrics->rans0_cnt >= MAXFAILS &&
			(metrics->rans0_extra += r) >= MAXDELTA)
			method &= ~(1<<RANS0);
		}

		if (best_method == RANS1) {
		    metrics->rans1_cnt = 0;
		    metrics->rans1_extra = 0;
		} else if (best_sz < metrics->sz_rans1) {
		    double r = (double)metrics->sz_rans1 / best_sz - 1;
		    if (++metrics->rans1_cnt >= MAXFAILS &&
			(metrics->rans1_extra += r) >= MAXDELTA)
			method &= ~(1<<RANS1);
		}

		if (best_method == BZIP2) {
		    metrics->bzip2_cnt = 0;
		    metrics->bzip2_extra = 0;
		} else if (best_sz < metrics->sz_bzip2) {
		    double r = (double)metrics->sz_bzip2 / best_sz - 1;
		    if (++metrics->bzip2_cnt >= MAXFAILS &&
			(metrics->bzip2_extra += r) >= MAXDELTA)
			method &= ~(1<<BZIP2);
		}

		if (best_method == LZMA) {
		    metrics->lzma_cnt = 0;
		    metrics->lzma_extra = 0;
		} else if (best_sz < metrics->sz_lzma) {
		    double r = (double)metrics->sz_lzma / best_sz - 1;
		    if (++metrics->lzma_cnt >= MAXFAILS &&
			(metrics->lzma_extra += r) >= MAXDELTA)
			method &= ~(1<<LZMA);
		}

		//if (method != metrics->revised_method)
		//    fprintf(stderr, "%d: method from %x to %x\n",
		//	    b->content_id, metrics->revised_method, method);
		metrics->revised_method = method;
	    }
	    pthread_mutex_unlock(&fd->metrics_lock);
	} else {
	    strat = metrics->strat;
	    method = metrics->method;

	    pthread_mutex_unlock(&fd->metrics_lock);
	    comp = cram_compress_by_method((char *)b->data, b->uncomp_size,
					   &comp_size, method,
					   level, strat);
	    if (!comp)
		return -1;
	    free(b->data);
	    b->data = (unsigned char *)comp;
	    b->comp_size = comp_size;
	    b->method = method;
	}

    } else {
	// no cached metrics, so just do zlib?
	comp = cram_compress_by_method((char *)b->data, b->uncomp_size,
				       &comp_size, GZIP, level, Z_FILTERED);
	if (!comp) {
	    fprintf(stderr, "Compression failed!\n");
	    return -1;
	}
	free(b->data);
	b->data = (unsigned char *)comp;
	b->comp_size = comp_size;
	b->method = GZIP;
    }

    if (fd->verbose)
	fprintf(stderr, "Compressed block ID %d from %d to %d by method %s\n",
		b->content_id, b->uncomp_size, b->comp_size,
		cram_block_method2str(b->method));

    if (b->method == RANS1)
	b->method = RANS0; // Spec just has RANS (not 0/1) with auto-sensing

    return 0;
}